

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall ON_ClassArray<ON_String>::Empty(ON_ClassArray<ON_String> *this)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = (ulong)*(uint *)(this + 0x10);
  lVar2 = uVar1 * 8;
  while( true ) {
    lVar2 = lVar2 + -8;
    if ((int)uVar1 < 1) break;
    ON_String::~ON_String((ON_String *)(*(long *)(this + 8) + lVar2));
    *(undefined8 *)(*(long *)(this + 8) + lVar2) = 0;
    ON_String::ON_String((ON_String *)(*(long *)(this + 8) + lVar2));
    uVar1 = (ulong)((int)uVar1 - 1);
  }
  *(undefined4 *)(this + 0x10) = 0;
  return;
}

Assistant:

void ON_ClassArray<T>::Empty()
{
  int i;
  for ( i = m_count-1; i >= 0; i-- ) {
    DestroyElement( m_a[i] );
    // This call to memset is ok even when T has a vtable
    // because in-place construction is used later.
    memset( (void*)(&m_a[i]), 0, sizeof(T) );
    ConstructDefaultElement( &m_a[i] );
  }
  m_count = 0;
}